

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::TestsetString::TestsetString(TestsetString *this)

{
  char *suiteName;
  TestsetString *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"setString",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x81);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestsetString_004588f0;
  return;
}

Assistant:

TEST(setString)
{
  static const char* strGood =
    "8=FIX.4.2\0019=45\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\00110=218\001";
  static const char* strNull =
    "8=FIX.4.2\0019=46\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\000\00110=219\001";
  static const char* strTrailingCharacter =
    "8=FIX.4.2\0019=45\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\00110=218\001 ";
  static const char* strNoChk =
    "8=FIX.4.2\0019=45\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\001";
  static const char* strBadChk =
    "8=FIX.4.2\0019=45\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\00110=000\001";
  static const char* strBad =
    "8=FIX.4.2\0019=45\00135=0\00134=3\001"
    "49garbled=TW\00152=20000426-12:05:06\00156=ISLD\00110=000\001";
  static const char* strBadHeaderOrder =
    "8=FIX.4.2\00135=0\0019=45\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\00110=218\001";
  static const char* strBodyFields =
    "8=FIX.4.2\0019=60\00135=D\00111=ORDERID\00121=3\00140=2\001"
    "54=1\00155=MSFT\00160=19000101-00:00:00\00110=226\001";
  static const char* strNoLengthAndChk =
    "8=FIX.4.2\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\001";
  static const char* strBadLength =
    "8=FIX.4.2\0019=AB\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\00110=218\001";
  static const char* strBadChecksum =
    "8=FIX.4.2\0019=45\00135=0\00134=3\00149=TW\001"
    "52=20000426-12:05:06\00156=ISLD\00110=ABC\001";
  static const char* strJunk =
    "paste your FIX message here, then hit ENTER";
  static const char* strEmpty =
    "";

  FIX::Message object;
  object.setString( strGood );
  object.setString( std::string(strNull, 68) );
  object.setString( strNoLengthAndChk, false );

  CHECK_THROW( object.setString( strTrailingCharacter ), InvalidMessage );
  CHECK_THROW( object.setString( strNoChk ), InvalidMessage );
  CHECK_THROW( object.setString( strBadChk ), InvalidMessage );
  CHECK_THROW( object.setString( strBad ), InvalidMessage );
  CHECK_THROW( object.setString( strBadHeaderOrder ), InvalidMessage );
  CHECK_THROW( object.setString( strNoLengthAndChk ), InvalidMessage );
  CHECK_THROW( object.setString( strBadLength ), InvalidMessage );
  CHECK_THROW( object.setString( strBadChecksum ), InvalidMessage );
  CHECK_THROW( object.setString( strJunk ), InvalidMessage );
  CHECK_THROW( object.setString( strEmpty ), InvalidMessage );

  DataDictionary dataDictionary;
  dataDictionary.addHeaderField( 11, false );
  dataDictionary.addTrailerField( 60, false );

  ClOrdID clOrdID;
  TransactTime transactTime;
  Symbol symbol;
  object.setString( strBodyFields, true, &dataDictionary );

  CHECK( object.getHeader().isSetField( clOrdID ) );
  CHECK( object.getTrailer().isSetField( transactTime ) );
  CHECK( object.isSetField( symbol ) );
}